

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O1

void P_Spawn3DFloors(void)

{
  int alpha;
  int param2;
  line_t *line;
  int line_00;
  uint param;
  long lVar1;
  long lVar2;
  
  if (0 < numlines) {
    line_00 = 0;
    line = lines;
    do {
      if (line->special == 0xa0) {
        if (level.maptype == MAPTYPE_HEXEN) {
          if ((line->args[1] & 8) == 0) {
            line->args[0] = line->args[0] + line->args[4] * 0x100;
            line->args[4] = 0;
          }
          else {
            FTagManager::AddLineID(&tagManager,line_00,line->args[4]);
          }
        }
        param2 = line->args[2];
        param = line->args[1] & 0xfffffff7;
        alpha = line->args[3];
LAB_004d0123:
        P_Set3DFloor(line,param,param2,alpha);
        line->special = 0;
        line->args[0] = 0;
        line->args[1] = 0;
        line->args[2] = 0;
        line->args[3] = 0;
        line->args[4] = 0;
      }
      else if (line->special == 0x32) {
        if (2 < (uint)line->args[1]) {
          line->args[1] = 0;
        }
        param2 = P_Spawn3DFloors::flagvals[line->args[1]];
        param = 3;
        alpha = 0;
        goto LAB_004d0123;
      }
      line_00 = line_00 + 1;
      line = line + 1;
    } while (line_00 < numlines);
  }
  if (0 < numsectors) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      P_Recalculate3DFloors((sector_t *)((long)&sectors->planes[0].xform.xOffs + lVar2));
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x268;
    } while (lVar1 < numsectors);
  }
  return;
}

Assistant:

void P_Spawn3DFloors (void)
{
	static int flagvals[] = {512, 2+512, 512+1024};
	int i;
	line_t * line;

	for (i=0,line=lines;i<numlines;i++,line++)
	{
		switch(line->special)
		{
		case ExtraFloor_LightOnly:
			if (line->args[1] < 0 || line->args[1] > 2) line->args[1] = 0;
			P_Set3DFloor(line, 3, flagvals[line->args[1]], 0);
			break;

		case Sector_Set3DFloor:
			// The flag high-byte/line id is only needed in Hexen format.
			// UDMF can set both of these parameters without any restriction of the usable values.
			// In Doom format the translators can take full integers for the tag and the line ID always is the same as the tag.
			if (level.maptype == MAPTYPE_HEXEN)	
			{
				if (line->args[1]&8)
				{
					tagManager.AddLineID(i, line->args[4]);
				}
				else
				{
					line->args[0]+=256*line->args[4];
					line->args[4]=0;
				}
			}
			P_Set3DFloor(line, line->args[1]&~8, line->args[2], line->args[3]);
			break;

		default:
			continue;
		}
		line->special=0;
		line->args[0] = line->args[1] = line->args[2] = line->args[3] = line->args[4] = 0;
	}
	// kg3D - do it in software
	for (i = 0; i < numsectors; i++)
	{
		P_Recalculate3DFloors(&sectors[i]);
	}
}